

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O2

bool __thiscall
cmFunctionFunctionBlocker::IsFunctionBlocked
          (cmFunctionFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *param_3)

{
  int iVar1;
  cmFunctionHelperCommand *this_00;
  cmState *pcVar2;
  string newName;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar1 = cmsys::SystemTools::Strucmp
                    ((lff->super_cmListFileContext).Name._M_dataplus._M_p,"function");
  if (iVar1 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    iVar1 = cmsys::SystemTools::Strucmp
                      ((lff->super_cmListFileContext).Name._M_dataplus._M_p,"endfunction");
    if (iVar1 == 0) {
      if (this->Depth == 0) {
        this_00 = (cmFunctionHelperCommand *)operator_new(200);
        cmFunctionHelperCommand::cmFunctionHelperCommand(this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&this_00->Args,&this->Args);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
                  (&this_00->Functions,&this->Functions);
        std::__cxx11::string::_M_assign((string *)&this_00->FilePath);
        cmMakefile::RecordPolicies(mf,&this_00->Policies);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_50 + 8),"_",
                       (this->Args).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
        pcVar2 = cmMakefile::GetState(mf);
        cmState::RenameCommand
                  (pcVar2,(this->Args).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,(string *)(local_50 + 8));
        pcVar2 = cmMakefile::GetState(mf);
        cmState::AddCommand(pcVar2,(cmCommand *)this_00);
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_50,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        if (local_50 != (undefined1  [8])0x0) {
          (*(code *)*(_List_node_base **)
                     ((long)((((list<cmDefinitions,_std::allocator<cmDefinitions>_> *)local_50)->
                             super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>).
                             _M_impl._M_node.super__List_node_base._M_next + 1) + 8))();
        }
        std::__cxx11::string::~string((string *)(local_50 + 8));
        return true;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmFunctionFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff, cmMakefile &mf,
                  cmExecutionStatus &)
{
  // record commands until we hit the ENDFUNCTION
  // at the ENDFUNCTION call we shift gears and start looking for invocations
  if(!cmSystemTools::Strucmp(lff.Name.c_str(),"function"))
    {
    this->Depth++;
    }
  else if(!cmSystemTools::Strucmp(lff.Name.c_str(),"endfunction"))
    {
    // if this is the endfunction for this function then execute
    if (!this->Depth)
      {
      // create a new command and add it to cmake
      cmFunctionHelperCommand *f = new cmFunctionHelperCommand();
      f->Args = this->Args;
      f->Functions = this->Functions;
      f->FilePath = this->GetStartingContext().FilePath;
      mf.RecordPolicies(f->Policies);

      std::string newName = "_" + this->Args[0];
      mf.GetState()->RenameCommand(this->Args[0], newName);
      mf.GetState()->AddCommand(f);

      // remove the function blocker now that the function is defined
      mf.RemoveFunctionBlocker(this, lff);
      return true;
      }
    else
      {
      // decrement for each nested function that ends
      this->Depth--;
      }
    }

  // if it wasn't an endfunction and we are not executing then we must be
  // recording
  this->Functions.push_back(lff);
  return true;
}